

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void denseScale(realtype c,realtype **a,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  realtype *col_j;
  sunindextype j;
  sunindextype i;
  sunindextype n_local;
  sunindextype m_local;
  realtype **a_local;
  realtype c_local;
  
  for (col_j = (realtype *)0x0; (long)col_j < n; col_j = (realtype *)((long)col_j + 1)) {
    prVar1 = a[(long)col_j];
    for (j = 0; j < m; j = j + 1) {
      prVar1[j] = c * prVar1[j];
    }
  }
  return;
}

Assistant:

void denseScale(realtype c, realtype **a, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (j=0; j < n; j++) {
    col_j = a[j];
    for (i=0; i < m; i++)
      col_j[i] *= c;
  }
}